

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyInner
          (LegacyScriptPubKeyMan *this,CKey *key,CPubKey *pubkey)

{
  long lVar1;
  array<unsigned_char,_32UL> *__first;
  WalletStorage *pWVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  allocator_type local_71;
  CKeyingMaterial vchSecret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock22,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x33a,false);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[9])
                    ();
  if ((char)iVar4 == '\0') {
    bVar3 = FillableSigningProvider::AddKeyPubKey
                      (&(this->super_LegacyDataSPKM).super_FillableSigningProvider,key,pubkey);
  }
  else {
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
              [10])();
    if ((char)iVar4 == '\0') {
      vchCryptedSecret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vchCryptedSecret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vchCryptedSecret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __first = (key->keydata)._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&vchSecret,
                 __first->_M_elems,__first[__first != (array<unsigned_char,_32UL> *)0x0]._M_elems,
                 &local_71);
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_98._M_unused._M_object = operator_new(0x18);
      *(vector<unsigned_char,secure_allocator<unsigned_char>> **)local_98._M_unused._0_8_ =
           (vector<unsigned_char,secure_allocator<unsigned_char>> *)&vchSecret;
      *(CPubKey **)((long)local_98._M_unused._0_8_ + 8) = pubkey;
      *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
       ((long)local_98._M_unused._0_8_ + 0x10) = &vchCryptedSecret;
      pcStack_80 = std::
                   _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:837:38)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:837:38)>
                 ::_M_manager;
      iVar4 = (*pWVar2->_vptr_WalletStorage[8])(pWVar2);
      std::_Function_base::~_Function_base((_Function_base *)&local_98);
      if ((char)iVar4 == '\0') {
        bVar3 = false;
      }
      else {
        bVar3 = AddCryptedKey(this,pubkey,&vchCryptedSecret);
      }
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                (&vchSecret.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vchCryptedSecret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
    }
    else {
      bVar3 = false;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyInner(const CKey& key, const CPubKey &pubkey)
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::AddKeyPubKey(key, pubkey);
    }

    if (m_storage.IsLocked()) {
        return false;
    }

    std::vector<unsigned char> vchCryptedSecret;
    CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
    if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return EncryptSecret(encryption_key, vchSecret, pubkey.GetHash(), vchCryptedSecret);
        })) {
        return false;
    }

    if (!AddCryptedKey(pubkey, vchCryptedSecret)) {
        return false;
    }
    return true;
}